

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::alert_manager::alert_manager
          (alert_manager *this,int queue_limit,alert_category_t alert_mask)

{
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_mutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  ::std::_V2::condition_variable_any::condition_variable_any(&this->m_condition);
  (this->m_alert_mask)._M_i.m_val = alert_mask.m_val;
  this->m_queue_size_limit = queue_limit;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[0].
  m_num_items = 0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[0].
  m_storage._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
  super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter> =
       (_Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>)0x0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[0].
  m_capacity = 0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[0].
  m_size = 0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[1].
  m_num_items = 0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[1].
  m_storage._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
  super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.super__Head_base<0UL,_char_*,_false>
  ._M_head_impl = (char *)0x0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[1].
  m_capacity = 0;
  (this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems[1].
  m_size = 0;
  (this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>._M_elems[0].m_storage.
  super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>._M_elems[0].
           m_storage.super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>._M_elems[0].
           m_storage.super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl + 0x10) = (pointer)0x0;
  (this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>._M_elems[1].m_storage.
  super_vector<char,_std::allocator<char>_>.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>._M_elems[1].
           m_storage.super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>._M_elems[1].
           m_storage.super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl + 0x10) = (pointer)0x0;
  (this->m_dropped).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->m_dropped).super__Base_bitset<2UL>._M_w[1] = 0;
  *(undefined8 *)&(this->m_notify).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_notify).super__Function_base._M_functor + 8) = 0;
  (this->m_notify).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_notify)._M_invoker = (_Invoker_type)0x0;
  this->m_generation = 0;
  (this->m_ses_extensions).
  super__List_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_ses_extensions;
  (this->m_ses_extensions).
  super__List_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_ses_extensions;
  (this->m_ses_extensions).
  super__List_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

alert_manager::alert_manager(int const queue_limit, alert_category_t const alert_mask)
		: m_alert_mask(alert_mask)
		, m_queue_size_limit(queue_limit)
	{}